

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

void basist::fixup_pvrtc1_4_modulation_rgb
               (decoder_etc_block *pETC_Blocks,uint32_t *pPVRTC_endpoints,void *pDst_blocks,
               uint32_t num_blocks_x,uint32_t num_blocks_y)

{
  uint32_t *puVar1;
  byte bVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  undefined4 in_register_0000000c;
  uint *puVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  uint *puVar34;
  int a3;
  uint uVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  int iVar41;
  long lVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  undefined4 in_register_00000084;
  ulong uVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  uint uVar51;
  long lVar52;
  uint32_t packed;
  ulong uVar53;
  ulong uVar54;
  undefined1 auVar55 [16];
  int iVar57;
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  int iVar59;
  int iVar63;
  int iVar64;
  undefined1 auVar60 [16];
  int iVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint32_t *pE_rows [3];
  int local_288 [6];
  ulong local_270;
  ulong local_268;
  uint local_25c;
  undefined8 local_258;
  ulong local_250;
  int local_248;
  uint local_244;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  undefined8 local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  uint local_1a4;
  int local_1a0;
  int local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_188;
  uint local_184;
  uint local_180;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_138;
  uint local_134;
  uint local_130;
  ulong local_110;
  decoder_etc_block *local_108;
  void *local_100;
  uint32_t *local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48 [3];
  
  local_100 = pDst_blocks;
  local_258 = CONCAT44(in_register_0000000c,num_blocks_x);
  local_25c = num_blocks_x - 1;
  local_1b4 = num_blocks_y - 1;
  uVar17 = 0x1f;
  if (local_25c != 0) {
    for (; local_25c >> uVar17 == 0; uVar17 = uVar17 - 1) {
    }
  }
  uVar17 = (uVar17 ^ 0xffffffe0) + 0x21;
  if (local_25c == 0) {
    uVar17 = 0;
  }
  uVar29 = 0x1f;
  if (local_1b4 != 0) {
    for (; local_1b4 >> uVar29 == 0; uVar29 = uVar29 - 1) {
    }
  }
  uVar29 = (uVar29 ^ 0xffffffe0) + 0x21;
  if (local_1b4 == 0) {
    uVar29 = 0;
  }
  local_f8 = pPVRTC_endpoints;
  if (uVar17 < uVar29) {
    uVar29 = uVar17;
  }
  local_108 = pETC_Blocks;
  local_110 = (ulong)uVar29;
  local_248 = uVar29 * 2;
  bVar23 = (byte)(uVar29 * 2);
  local_1e8 = CONCAT44(in_register_00000084,num_blocks_y);
  if (0 < (int)num_blocks_y) {
    local_244 = ~(-1 << (bVar23 & 0x1f));
    local_d0 = (ulong)num_blocks_y;
    local_1f8 = 0;
    local_1f0 = 0;
    uVar17 = local_25c;
    do {
      puVar27 = &local_198;
      puVar34 = &local_158;
      lVar42 = 0;
      do {
        puVar1 = local_f8 + (((uint)local_1f8 - 1) + (int)lVar42 & local_1b4) * num_blocks_x;
        local_48[lVar42] = (long)puVar1;
        uVar29 = 0xffffffff;
        lVar52 = 0;
        do {
          uVar30 = puVar1[uVar29 & uVar17];
          if (-1 < (short)uVar30) goto LAB_0013ee4f;
          iVar36 = ((uVar30 & 0x1e) >> 4) + (uVar30 >> 10 & 0x1f) +
                   (uVar30 >> 5 & 0x1f) + (uVar30 & 0x1e);
          uVar35 = (uint)(iVar36 * 0x83abd) >> 0x10;
          *(uint *)((long)puVar34 + lVar52) = ((iVar36 * 0xff - uVar35 & 0xffff) >> 1) + uVar35 >> 4
          ;
          if (-1 < (int)uVar30) goto LAB_0013ee04;
          *(uint *)((long)puVar27 + lVar52) =
               (((uVar30 >> 0x10 & 0x1f) + (uVar30 >> 0x15 & 0x1f) + (uVar30 >> 0x1a & 0x1f)) * 0xff
               ) / 0x1f;
          uVar29 = uVar29 + 1;
          lVar52 = lVar52 + 0x10;
        } while (lVar52 != 0x30);
        lVar42 = lVar42 + 1;
        puVar34 = puVar34 + 1;
        puVar27 = puVar27 + 1;
      } while (lVar42 != 3);
      if (0 < (int)num_blocks_x) {
        local_240 = (ulong)local_158;
        local_238 = (ulong)local_198;
        uVar3 = (&g_pvrtc_swizzle_table)[local_1f8 & 0xff];
        uVar4 = (&g_pvrtc_swizzle_table)[local_1f8 >> 8 & 0xffffff];
        local_1bc = ((uint)local_1f8 >> ((byte)local_110 & 0x1f)) << (bVar23 & 0x1f);
        local_1b8 = CONCAT22(uVar4,uVar3);
        local_b8 = local_48[0];
        local_c0 = local_48[1];
        local_c8 = local_48[2];
        local_220 = (ulong)local_154;
        local_228 = (ulong)local_188;
        local_218 = (ulong)local_194;
        local_1d0 = (ulong)local_180;
        uVar46 = (ulong)local_184;
        uVar28 = 0;
        uVar54 = (ulong)local_190;
        uVar17 = local_140;
        uVar29 = local_148;
        uVar30 = local_144;
        do {
          uVar12 = uVar30;
          uVar35 = uVar29;
          local_140 = uVar17;
          uVar16 = local_1d0;
          uVar15 = local_228;
          local_270 = (ulong)local_150;
          local_268 = uVar54;
          uVar47 = (uint)uVar28;
          uVar17 = (uint)(ushort)(&g_pvrtc_swizzle_table)[uVar28 & 0xff] * 2 |
                   (uint)(ushort)(&g_pvrtc_swizzle_table)[uVar28 >> 8] << 0x11 |
                   CONCAT22(uVar4,uVar3);
          local_200 = (ulong)uVar12;
          local_250 = uVar46;
          if (num_blocks_x != num_blocks_y) {
            uVar17 = uVar17 & local_244;
            if (num_blocks_y < num_blocks_x) {
              uVar17 = uVar17 | (uVar47 >> ((byte)local_110 & 0x1f)) << (bVar23 & 0x1f);
            }
            else {
              uVar17 = uVar17 | local_1bc;
            }
          }
          uVar38 = (ulong)((int)local_1f0 + uVar47);
          uVar53 = (ulong)uVar17;
          *(uint32_t *)((long)local_100 + uVar53 * 8 + 4) = local_f8[uVar38];
          uVar17 = local_108[uVar38].field_0.m_uint32[0];
          iVar36 = (uint)(byte)g_pvrtc_5[uVar17 >> 0x13 & 0x1f] +
                   (uint)(byte)g_pvrtc_5[uVar17 >> 0xb & 0x1f] +
                   (uint)(byte)g_pvrtc_5[uVar17 >> 3 & 0x1f];
          uVar28 = (ulong)(uVar17 >> 0x19 & 0xfffffff0);
          local_288[0] = *(int *)(g_etc1_inten_tables48 + uVar28 + 8) + iVar36 * 0x10;
          local_288[1] = *(int *)(g_etc1_inten_tables48 + uVar28 + 4) + iVar36 * 0x10;
          local_288[2] = *(int *)(g_etc1_inten_tables48 + uVar28 + 4) + iVar36 * 0x10;
          local_288[3] = *(int *)(g_etc1_inten_tables48 + uVar28) + iVar36 * 0x10;
          uVar47 = uVar47 + 1;
          uVar28 = (ulong)(uVar47 & local_25c);
          uVar17 = *(uint *)(local_48[0] + uVar28 * 4);
          local_180 = (uint)local_1d0;
          local_190 = (uint)uVar54;
          if (-1 < (short)uVar17) {
LAB_0013ee4f:
            __assert_fail("packed & 0x8000",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xceb,"uint32_t basist::get_opaque_endpoint_l0(uint32_t)");
          }
          if (-1 < (int)uVar17) {
LAB_0013ee04:
            __assert_fail("packed & 0x8000",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xcfa,"uint32_t basist::get_opaque_endpoint_l1(uint32_t)");
          }
          uVar5 = *(uint *)(local_48[1] + uVar28 * 4);
          if (-1 < (short)uVar5) goto LAB_0013ee4f;
          if (-1 < (int)uVar5) goto LAB_0013ee04;
          uVar6 = *(uint *)(local_48[2] + uVar28 * 4);
          if (-1 < (short)uVar6) goto LAB_0013ee4f;
          if (-1 < (int)uVar6) goto LAB_0013ee04;
          local_50 = (ulong)uVar47;
          iVar48 = ((uVar17 & 0x1e) >> 4) + (uVar17 >> 10 & 0x1f) +
                   (uVar17 >> 5 & 0x1f) + (uVar17 & 0x1e);
          local_58 = uVar53;
          uVar29 = (uint)(iVar48 * 0x83abd) >> 0x10;
          iVar49 = ((uVar5 & 0x1e) >> 4) + (uVar5 >> 10 & 0x1f) +
                   (uVar5 >> 5 & 0x1f) + (uVar5 & 0x1e);
          uVar30 = (uint)(iVar49 * 0x83abd) >> 0x10;
          iVar36 = ((uVar6 & 0x1e) >> 4) + (uVar6 >> 10 & 0x1f) +
                   (uVar6 >> 5 & 0x1f) + (uVar6 & 0x1e);
          uVar43 = (uint)(iVar36 * 0x83abd) >> 0x10;
          bVar2 = local_108[uVar38].field_0.m_bytes[4];
          local_1c8 = (ulong)bVar2;
          local_210 = local_228;
          local_68 = (ulong)(bVar2 & 0xfffffff0 | (uint)(local_108[uVar38].field_0.m_bytes[6] >> 4))
          ;
          local_208 = (ulong)uVar35;
          uVar29 = ((iVar48 * 0xff - uVar29 & 0xffff) >> 1) + uVar29 >> 4;
          uVar39 = (((uVar17 >> 0x10 & 0x1f) + (uVar17 >> 0x15 & 0x1f) + (uVar17 >> 0x1a & 0x1f)) *
                   0xff) / 0x1f;
          local_228 = (ulong)uVar39;
          uVar30 = ((iVar49 * 0xff - uVar30 & 0xffff) >> 1) + uVar30 >> 4;
          uVar31 = (((uVar5 >> 0x10 & 0x1f) + (uVar5 >> 0x15 & 0x1f) + (uVar5 >> 0x1a & 0x1f)) *
                   0xff) / 0x1f;
          local_d8 = (ulong)uVar31;
          uVar17 = ((iVar36 * 0xff - uVar43 & 0xffff) >> 1) + uVar43 >> 4;
          uVar40 = (((uVar6 >> 0x10 & 0x1f) + (uVar6 >> 0x15 & 0x1f) + (uVar6 >> 0x1a & 0x1f)) *
                   0xff) / 0x1f;
          uVar5 = (uint)uVar46;
          uVar43 = uVar5 * 9;
          local_e8 = (ulong)uVar43;
          local_230 = uVar38;
          local_1a0 = uVar31 * 3 + uVar43;
          uVar7 = uVar12 * 9;
          local_1a8 = uVar30 * 3;
          local_90 = (ulong)uVar7;
          local_1a4 = local_140 * 3;
          iVar36 = uVar17 + uVar7 + local_1a8 + local_1a4;
          local_e0 = local_1d0;
          uVar6 = local_180 * 3;
          local_70 = (ulong)uVar6;
          local_1d0 = (ulong)uVar40;
          iVar48 = uVar40 + uVar6 + local_1a0;
          local_19c = (local_288[(byte)g_etc1_x_selector_unpack[local_68 + 0x300]] - iVar36) * -0x10
          ;
          if (iVar36 <= iVar48) {
            local_19c = (local_288[(byte)g_etc1_x_selector_unpack[local_68 + 0x300]] - iVar36) *
                        0x10;
          }
          uVar10 = iVar48 - iVar36;
          if (iVar48 < iVar36) {
            uVar10 = -(iVar48 - iVar36);
          }
          local_60 = (ulong)uVar10;
          uVar32 = uVar12 + uVar35;
          local_1e0 = (ulong)uVar32;
          uVar11 = (uint)uVar15;
          uVar18 = uVar5 + uVar11;
          local_1d8 = (ulong)uVar18;
          iVar36 = uVar18 * 8;
          uVar19 = iVar36 + uVar32 * -8;
          if (SBORROW4(iVar36,uVar32 * 8) != (int)uVar19 < 0) {
            uVar19 = -(iVar36 + uVar32 * -8);
          }
          local_a0 = (ulong)uVar19;
          local_1c8 = (ulong)((bVar2 & 0xf) << 4 | local_108[uVar38].field_0.m_bytes[6] & 0xf);
          iVar48 = local_288[(byte)g_etc1_x_selector_unpack[local_1c8]] + uVar32 * -8;
          local_1ac = iVar48 * -0x10;
          if (SBORROW4(iVar36,uVar32 * 8) == (int)(iVar36 + uVar32 * -8) < 0) {
            local_1ac = iVar48 * 0x10;
          }
          uVar9 = uVar35 * 3;
          local_80 = (ulong)uVar9;
          iVar36 = (int)local_220;
          uVar22 = iVar36 * 3;
          iVar48 = (int)local_240;
          local_98 = (ulong)uVar22;
          iVar33 = iVar48 + uVar22 + uVar7 + uVar9;
          uVar13 = uVar11 * 3;
          local_78 = (ulong)uVar13;
          iVar49 = (int)local_218;
          uVar14 = iVar49 * 3;
          iVar50 = (int)local_238;
          local_88 = (ulong)uVar14;
          iVar44 = iVar50 + uVar14 + uVar43 + uVar13;
          uVar8 = iVar44 - iVar33;
          if (iVar44 < iVar33) {
            uVar8 = -(iVar44 - iVar33);
          }
          local_b0 = (ulong)uVar8;
          local_230 = (ulong)(local_108[uVar38].field_0.m_bytes[5] & 0xfffffff0 |
                             (uint)(local_108[uVar38].field_0.m_bytes[7] >> 4));
          local_1b0 = (local_288[(byte)g_etc1_x_selector_unpack[local_230 + 0x100]] - iVar33) *
                      -0x10;
          if (iVar33 <= iVar44) {
            local_1b0 = (local_288[(byte)g_etc1_x_selector_unpack[local_230 + 0x100]] - iVar33) *
                        0x10;
          }
          iVar37 = iVar36 * 6 + (uVar35 + iVar48) * 2 + uVar12 * 6;
          iVar44 = iVar49 * 6 + (uVar11 + iVar50) * 2 + uVar5 * 6;
          iVar33 = iVar44 - iVar37;
          if (iVar44 < iVar37) {
            iVar33 = -(iVar44 - iVar37);
          }
          local_f0 = (ulong)((local_108[uVar38].field_0.m_bytes[5] & 0xf) << 4 |
                            local_108[uVar38].field_0.m_bytes[7] & 0xf);
          iVar26 = (local_288[(byte)g_etc1_x_selector_unpack[local_f0 + 0x100]] - iVar37) * -0x10;
          if (iVar37 <= iVar44) {
            iVar26 = (local_288[(byte)g_etc1_x_selector_unpack[local_f0 + 0x100]] - iVar37) * 0x10;
          }
          uVar32 = uVar32 * 6;
          local_1e0 = (ulong)uVar32;
          iVar37 = uVar32 + (iVar48 + iVar36) * 2;
          uVar18 = uVar18 * 6;
          local_1d8 = (ulong)uVar18;
          iVar41 = uVar18 + (iVar50 + iVar49) * 2;
          iVar44 = iVar41 - iVar37;
          if (iVar41 < iVar37) {
            iVar44 = -(iVar41 - iVar37);
          }
          iVar45 = (local_288[(byte)g_etc1_x_selector_unpack[local_230]] - iVar37) * -0x10;
          if (iVar37 <= iVar41) {
            iVar45 = (local_288[(byte)g_etc1_x_selector_unpack[local_230]] - iVar37) * 0x10;
          }
          iVar41 = iVar36 + uVar12;
          iVar37 = uVar35 + iVar48 + iVar41;
          uVar20 = uVar5 + iVar49;
          local_a8 = (ulong)uVar20;
          iVar50 = (uVar11 + iVar50 + uVar20) * 4;
          iVar48 = iVar50 + iVar37 * -4;
          if (iVar50 < iVar37 * 4) {
            iVar48 = -(iVar50 + iVar37 * -4);
          }
          iVar21 = local_288[(byte)g_etc1_x_selector_unpack[local_f0]] + iVar37 * -4;
          iVar57 = iVar21 * -0x10;
          if (iVar37 * 4 <= iVar50) {
            iVar57 = iVar21 * 0x10;
          }
          uVar24 = (uint)(iVar57 != iVar48 * 3 &&
                         SBORROW4(iVar57,iVar48 * 3) == iVar57 + iVar48 * -3 < 0);
          if (iVar57 != iVar48 * 8 && SBORROW4(iVar57,iVar48 * 8) == iVar57 + iVar48 * -8 < 0) {
            uVar24 = 2;
          }
          if (iVar48 * 0xd < iVar57) {
            uVar24 = 3;
          }
          local_238 = (ulong)uVar24;
          uVar51 = (uint)(iVar45 != iVar44 * 3 &&
                         SBORROW4(iVar45,iVar44 * 3) == iVar45 + iVar44 * -3 < 0) << 2;
          if (iVar45 != iVar44 * 8 && SBORROW4(iVar45,iVar44 * 8) == iVar45 + iVar44 * -8 < 0) {
            uVar51 = 8;
          }
          if (iVar44 * 0xd < iVar45) {
            uVar51 = 0xc;
          }
          iVar48 = (uint)(iVar26 != iVar33 * 3 &&
                         SBORROW4(iVar26,iVar33 * 3) == iVar26 + iVar33 * -3 < 0) << 8;
          if (iVar26 != iVar33 * 8 && SBORROW4(iVar26,iVar33 * 8) == iVar26 + iVar33 * -8 < 0) {
            iVar48 = 0x200;
          }
          if (iVar33 * 0xd < iVar26) {
            iVar48 = 0x300;
          }
          uVar25 = (uint)((int)(uVar8 * 3) < local_1b0) << 10;
          if (local_1b0 != uVar8 * 8 &&
              SBORROW4(local_1b0,uVar8 * 8) == (int)(local_1b0 + uVar8 * -8) < 0) {
            uVar25 = 0x800;
          }
          if ((int)(uVar8 * 0xd) < local_1b0) {
            uVar25 = 0xc00;
          }
          local_240 = (ulong)uVar25;
          iVar50 = (uint)((int)(uVar19 * 3) < local_1ac) << 4;
          if (local_1ac != uVar19 * 8 &&
              SBORROW4(local_1ac,uVar19 * 8) == (int)(local_1ac + uVar19 * -8) < 0) {
            iVar50 = 0x20;
          }
          if ((int)(uVar19 * 0xd) < local_1ac) {
            iVar50 = 0x30;
          }
          iVar37 = uVar7 + uVar29 + local_1a8;
          iVar26 = uVar7 + uVar22 + local_150;
          auVar71 = pmovsxbd(in_XMM9,0x3030303);
          auVar74 = pmovsxbd(in_XMM10,0x4040404);
          auVar69._8_8_ = auVar74._8_8_ & 0xffffffff00000000 | (ulong)local_1a4;
          auVar69._0_8_ = auVar74._0_8_ & 0xffffffff | (ulong)(uint)(iVar41 * 6) << 0x20;
          iVar33 = uVar12 * 0xc;
          auVar80._4_4_ = iVar33;
          auVar80._0_4_ = iVar33;
          auVar80._8_4_ = iVar33;
          auVar80._12_4_ = iVar33;
          iVar45 = uVar43 + uVar14 + local_190;
          auVar75._8_8_ = auVar74._8_8_ & 0xffffffff00000000 | (ulong)uVar6;
          auVar75._0_8_ = auVar74._0_8_ & 0xffffffff | (ulong)(uVar20 * 6) << 0x20;
          iVar44 = uVar5 * 0xc;
          auVar77._4_4_ = iVar44;
          auVar77._0_4_ = iVar44;
          auVar77._8_4_ = iVar44;
          auVar77._12_4_ = iVar44;
          auVar66._0_4_ = uVar32 + uVar29 * 2 + uVar30 * 2;
          auVar66._4_4_ = iVar33 + uVar35 * 4;
          auVar66._8_4_ = uVar9 + iVar37;
          auVar66._12_4_ = auVar71._12_4_;
          uVar22 = (uint)((int)(uVar10 * 3) < local_19c) << 0x1e;
          auVar72._0_4_ = uVar18 + uVar39 * 2 + uVar31 * 2;
          auVar72._4_4_ = iVar44 + uVar11 * 4;
          auVar72._8_4_ = uVar13 + local_1a0 + uVar39;
          auVar72._12_4_ = auVar71._12_4_;
          auVar74 = pblendw(auVar80,auVar69,0xfc);
          auVar71._0_4_ = uVar30 << 4;
          auVar71._4_4_ = uVar35 << 5;
          auVar71._8_4_ = iVar37 * 8;
          auVar71._12_4_ = iVar41 * 8;
          auVar71 = pblendw(auVar71,auVar66,0x3f);
          auVar81._0_4_ = auVar74._0_4_ + iVar36 * 4;
          auVar81._4_4_ = auVar74._4_4_ + (local_150 + local_140) * 2;
          auVar81._12_4_ = auVar74._12_4_;
          auVar81._8_4_ = auVar74._8_4_ + iVar26;
          auVar60._0_4_ = iVar36 << 6;
          auVar60._4_4_ = (local_150 + local_140) * 0x20;
          auVar60._8_4_ = iVar26 * 0x10;
          auVar60._12_4_ = uVar12 << 4;
          auVar74 = pblendw(auVar60,auVar81,0x3f);
          auVar78 = pblendw(auVar77,auVar75,0xfc);
          auVar79._0_4_ = auVar78._0_4_ + iVar49 * 4;
          auVar79._4_4_ = auVar78._4_4_ + (local_190 + local_180) * 2;
          auVar79._12_4_ = auVar78._12_4_;
          auVar79._8_4_ = auVar78._8_4_ + iVar45;
          auVar82._0_4_ = uVar31 << 4;
          auVar82._4_4_ = uVar11 << 5;
          auVar82._8_4_ = (local_1a0 + uVar39) * 8;
          auVar82._12_4_ = uVar20 * 8;
          auVar78 = pblendw(auVar82,auVar72,0x3f);
          auVar83._0_4_ = iVar49 << 6;
          auVar83._4_4_ = (local_190 + local_180) * 0x20;
          auVar83._8_4_ = iVar45 * 0x10;
          auVar83._12_4_ = uVar5 << 4;
          auVar84 = pblendw(auVar83,auVar79,0x3f);
          iVar36 = auVar71._0_4_;
          iVar49 = auVar71._4_4_;
          iVar37 = auVar71._8_4_;
          iVar26 = auVar71._12_4_;
          iVar59 = auVar74._0_4_;
          iVar63 = auVar74._4_4_;
          iVar64 = auVar74._8_4_;
          iVar65 = auVar74._12_4_;
          uVar6 = (uint)(auVar78._0_4_ < iVar36);
          uVar7 = (uint)(auVar78._4_4_ < iVar49);
          uVar32 = (uint)(auVar78._8_4_ < iVar37);
          uVar8 = (uint)(auVar78._12_4_ < iVar26);
          uVar43 = (uint)(auVar84._0_4_ < iVar59);
          uVar19 = (uint)(auVar84._4_4_ < iVar63);
          uVar18 = (uint)(auVar84._8_4_ < iVar64);
          uVar9 = (uint)(auVar84._12_4_ < iVar65);
          auVar70._0_4_ = (auVar84._0_4_ - iVar59 ^ -uVar43) + uVar43;
          auVar70._4_4_ = (auVar84._4_4_ - iVar63 ^ -uVar19) + uVar19;
          auVar70._8_4_ = (auVar84._8_4_ - iVar64 ^ -uVar18) + uVar18;
          auVar70._12_4_ = (auVar84._12_4_ - iVar65 ^ -uVar9) + uVar9;
          auVar73._0_4_ = (auVar78._0_4_ - iVar36 ^ -uVar6) + uVar6;
          auVar73._4_4_ = (auVar78._4_4_ - iVar49 ^ -uVar7) + uVar7;
          auVar73._8_4_ = (auVar78._8_4_ - iVar37 ^ -uVar32) + uVar32;
          auVar73._12_4_ = (auVar78._12_4_ - iVar26 ^ -uVar8) + uVar8;
          iVar41 = ((local_288[(byte)g_etc1_x_selector_unpack[local_68]] - iVar36) * 0x10 ^ -uVar6)
                   + uVar6;
          iVar45 = ((local_288[(byte)g_etc1_x_selector_unpack[local_1c8 + 0x100]] - iVar49) * 0x10 ^
                   -uVar7) + uVar7;
          iVar57 = ((local_288[(byte)g_etc1_x_selector_unpack[local_68 + 0x100]] - iVar37) * 0x10 ^
                   -uVar32) + uVar32;
          iVar21 = ((local_288[(byte)g_etc1_x_selector_unpack[local_f0 + 0x200]] - iVar26) * 0x10 ^
                   -uVar8) + uVar8;
          iVar36 = ((local_288[(byte)g_etc1_x_selector_unpack[local_230 + 0x200]] - iVar59) * 0x10 ^
                   -uVar43) + uVar43;
          iVar49 = ((local_288[(byte)g_etc1_x_selector_unpack[local_f0 + 0x300]] - iVar63) * 0x10 ^
                   -uVar19) + uVar19;
          iVar37 = ((local_288[(byte)g_etc1_x_selector_unpack[local_230 + 0x300]] - iVar64) * 0x10 ^
                   -uVar18) + uVar18;
          iVar26 = ((local_288[(byte)g_etc1_x_selector_unpack[local_1c8 + 0x200]] - iVar65) * 0x10 ^
                   -uVar9) + uVar9;
          auVar67._0_4_ = -(uint)(auVar70._0_4_ * 3 < iVar36);
          auVar67._4_4_ = -(uint)(auVar70._4_4_ * 3 < iVar49);
          auVar67._8_4_ = -(uint)(auVar70._8_4_ * 3 < iVar37);
          auVar67._12_4_ = -(uint)(auVar70._12_4_ * 3 < iVar26);
          auVar76._0_4_ = -(uint)(auVar73._0_4_ * 3 < iVar41);
          auVar76._4_4_ = -(uint)(auVar73._4_4_ * 3 < iVar45);
          auVar76._8_4_ = -(uint)(auVar73._8_4_ * 3 < iVar57);
          auVar76._12_4_ = -(uint)(auVar73._12_4_ * 3 < iVar21);
          auVar61._0_4_ = -(uint)(auVar73._0_4_ * 8 < iVar41);
          auVar61._4_4_ = -(uint)(auVar73._4_4_ * 8 < iVar45);
          auVar61._8_4_ = -(uint)(auVar73._8_4_ * 8 < iVar57);
          auVar61._12_4_ = -(uint)(auVar73._12_4_ * 8 < iVar21);
          auVar74._0_4_ = -(uint)(auVar70._0_4_ * 8 < iVar36);
          auVar74._4_4_ = -(uint)(auVar70._4_4_ * 8 < iVar49);
          auVar74._8_4_ = -(uint)(auVar70._8_4_ * 8 < iVar37);
          auVar74._12_4_ = -(uint)(auVar70._12_4_ * 8 < iVar26);
          auVar74 = blendvps(auVar67 & _DAT_00277640,_DAT_00277650,auVar74);
          auVar78 = blendvps(auVar76 & _DAT_00277630,_DAT_00277660,auVar61);
          auVar71 = pmovsxbd(auVar61,0xd0d0d0d);
          in_XMM9 = pmulld(auVar73,auVar71);
          auVar56._0_4_ = -(uint)(in_XMM9._0_4_ < iVar41);
          auVar56._4_4_ = -(uint)(in_XMM9._4_4_ < iVar45);
          auVar56._8_4_ = -(uint)(in_XMM9._8_4_ < iVar57);
          auVar56._12_4_ = -(uint)(in_XMM9._12_4_ < iVar21);
          in_XMM10 = blendvps(auVar78,_DAT_00277680,auVar56);
          auVar71 = pmulld(auVar70,auVar71);
          auVar68._0_4_ = -(uint)(auVar71._0_4_ < iVar36);
          auVar68._4_4_ = -(uint)(auVar71._4_4_ < iVar49);
          auVar68._8_4_ = -(uint)(auVar71._8_4_ < iVar37);
          auVar68._12_4_ = -(uint)(auVar71._12_4_ < iVar26);
          auVar68 = blendvps(auVar74,_DAT_00277690,auVar68);
          auVar68 = auVar68 | in_XMM10;
          iVar49 = iVar33 + uVar30 * 4;
          iVar33 = iVar33 + local_140 * 4;
          iVar36 = iVar44 + uVar31 * 4;
          iVar44 = iVar44 + local_180 * 4;
          uVar6 = (uint)(iVar36 < iVar49);
          uVar43 = (uint)(iVar44 < iVar33);
          uVar28 = CONCAT44(iVar44 - iVar33,iVar36 - iVar49) ^ CONCAT44(-uVar43,-uVar6);
          auVar62._0_4_ = (int)uVar28 + uVar6;
          auVar62._4_4_ = (int)(uVar28 >> 0x20) + uVar43;
          auVar62._8_8_ = 0;
          uVar28 = CONCAT44((local_288[(byte)g_etc1_x_selector_unpack[local_1c8 + 0x300]] - iVar33)
                            * 0x10,(local_288[(byte)g_etc1_x_selector_unpack[local_68 + 0x200]] -
                                   iVar49) * 0x10) ^ CONCAT44(-uVar43,-uVar6);
          iVar36 = (int)uVar28 + uVar6;
          iVar49 = (int)(uVar28 >> 0x20) + uVar43;
          auVar55._0_4_ = -(uint)(auVar62._0_4_ * 3 < iVar36);
          auVar55._4_4_ = -(uint)(auVar62._4_4_ * 3 < iVar49);
          auVar55._8_8_ = 0;
          auVar78._0_4_ = -(uint)(auVar62._0_4_ * 8 < iVar36);
          auVar78._4_4_ = -(uint)(auVar62._4_4_ * 8 < iVar49);
          auVar78._8_8_ = 0;
          auVar71 = blendvps(auVar55 & _DAT_002776a0,_DAT_002776b0,auVar78);
          auVar74 = pmulld(auVar62,_DAT_002776c0);
          auVar58._0_4_ = -(uint)(auVar74._0_4_ < iVar36);
          auVar58._4_4_ = -(uint)(auVar74._4_4_ < iVar49);
          auVar58._8_4_ = -(uint)(auVar74._8_4_ < 0);
          auVar58._12_4_ = -(uint)(auVar74._12_4_ < 0);
          auVar71 = blendvps(auVar71,_DAT_002776d0,auVar58);
          auVar84._0_8_ = auVar68._8_8_;
          auVar84._8_4_ = auVar68._8_4_;
          auVar84._12_4_ = auVar68._12_4_;
          if (local_19c != uVar10 * 8 &&
              SBORROW4(local_19c,uVar10 * 8) == (int)(local_19c + uVar10 * -8) < 0) {
            uVar22 = 0x80000000;
          }
          if ((int)(uVar10 * 0xd) < local_19c) {
            uVar22 = 0xc0000000;
          }
          *(uint *)((long)local_100 + uVar53 * 8) =
               auVar71._4_4_ | auVar71._0_4_ | iVar50 + uVar25 | iVar48 + uVar24 | uVar51 | uVar22 |
               SUB164(auVar84 | auVar68,4) | SUB164(auVar84 | auVar68,0);
          local_218 = uVar46;
          local_220 = (ulong)uVar12;
          local_240 = (ulong)uVar35;
          local_238 = uVar15;
          uVar46 = local_d8;
          uVar28 = local_50;
          uVar54 = uVar16;
          local_150 = local_140;
        } while (num_blocks_x != uVar47);
        local_140 = uVar17;
        local_190 = local_180;
        local_180 = uVar40;
        local_138 = uVar29;
        local_178 = uVar39;
        local_134 = uVar30;
        local_174 = uVar31;
        local_130 = uVar17;
        local_170 = uVar40;
        local_148 = uVar29;
        local_154 = uVar12;
        local_144 = uVar30;
        local_188 = uVar39;
        local_194 = uVar5;
        local_184 = uVar31;
        local_1f0 = (ulong)((int)local_1f0 + uVar47);
        uVar17 = local_25c;
        local_158 = uVar35;
        local_198 = uVar11;
      }
      local_1f8 = local_1f8 + 1;
    } while (local_1f8 != local_d0);
  }
  return;
}

Assistant:

static void fixup_pvrtc1_4_modulation_rgb(const decoder_etc_block* pETC_Blocks, const uint32_t* pPVRTC_endpoints, void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y)
	{
		const uint32_t x_mask = num_blocks_x - 1;
		const uint32_t y_mask = num_blocks_y - 1;
		const uint32_t x_bits = basisu::total_bits(x_mask);
		const uint32_t y_bits = basisu::total_bits(y_mask);
		const uint32_t min_bits = basisu::minimum(x_bits, y_bits);
		//const uint32_t max_bits = basisu::maximum(x_bits, y_bits);
		const uint32_t swizzle_mask = (1 << (min_bits * 2)) - 1;

		uint32_t block_index = 0;

		// really 3x3
		int e0[4][4], e1[4][4];

		for (int y = 0; y < static_cast<int>(num_blocks_y); y++)
		{
			const uint32_t* pE_rows[3];

			for (int ey = 0; ey < 3; ey++)
			{
				int by = y + ey - 1; 

				const uint32_t* pE = &pPVRTC_endpoints[(by & y_mask) * num_blocks_x];

				pE_rows[ey] = pE;

				for (int ex = 0; ex < 3; ex++)
				{
					int bx = 0 + ex - 1; 

					const uint32_t e = pE[bx & x_mask];

					e0[ex][ey] = (get_opaque_endpoint_l0(e) * 255) / 31;
					e1[ex][ey] = (get_opaque_endpoint_l1(e) * 255) / 31;
				}
			}

			const uint32_t y_swizzle = (g_pvrtc_swizzle_table[y >> 8] << 16) | g_pvrtc_swizzle_table[y & 0xFF];

			for (int x = 0; x < static_cast<int>(num_blocks_x); x++, block_index++)
			{
				const decoder_etc_block& src_block = pETC_Blocks[block_index];

				const uint32_t x_swizzle = (g_pvrtc_swizzle_table[x >> 8] << 17) | (g_pvrtc_swizzle_table[x & 0xFF] << 1);

				uint32_t swizzled = x_swizzle | y_swizzle;
				if (num_blocks_x != num_blocks_y)
				{
					swizzled &= swizzle_mask;

					if (num_blocks_x > num_blocks_y)
						swizzled |= ((x >> min_bits) << (min_bits * 2));
					else
						swizzled |= ((y >> min_bits) << (min_bits * 2));
				}

				pvrtc4_block* pDst_block = static_cast<pvrtc4_block*>(pDst_blocks) + swizzled;
				pDst_block->m_endpoints = pPVRTC_endpoints[block_index];

				uint32_t base_r = g_etc_5_to_8[src_block.m_differential.m_red1];
				uint32_t base_g = g_etc_5_to_8[src_block.m_differential.m_green1];
				uint32_t base_b = g_etc_5_to_8[src_block.m_differential.m_blue1];

				const int* pInten_table48 = g_etc1_inten_tables48[src_block.m_differential.m_cw1];
				int by = (base_r + base_g + base_b) * 16;
				int block_colors_y_x16[4];
				block_colors_y_x16[0] = by + pInten_table48[2];
				block_colors_y_x16[1] = by + pInten_table48[3];
				block_colors_y_x16[2] = by + pInten_table48[1];
				block_colors_y_x16[3] = by + pInten_table48[0];

				{
					const uint32_t ex = 2;
					int bx = x + ex - 1;
					bx &= x_mask;

#define DO_ROW(ey) \
					{ \
						const uint32_t e = pE_rows[ey][bx]; \
						e0[ex][ey] = (get_opaque_endpoint_l0(e) * 255) / 31; \
						e1[ex][ey] = (get_opaque_endpoint_l1(e) * 255) / 31; \
					}

					DO_ROW(0);
					DO_ROW(1);
					DO_ROW(2);
#undef DO_ROW
				}

				uint32_t mod = 0;

				uint32_t lookup_x[4];

#define DO_LOOKUP(lx) { \
					const uint32_t byte_ofs = 7 - (((lx) * 4) >> 3); \
					const uint32_t lsb_bits = src_block.m_bytes[byte_ofs] >> (((lx) & 1) * 4); \
					const uint32_t msb_bits = src_block.m_bytes[byte_ofs - 2] >> (((lx) & 1) * 4); \
					lookup_x[lx] = (lsb_bits & 0xF) | ((msb_bits & 0xF) << 4); }

				DO_LOOKUP(0);
				DO_LOOKUP(1);
				DO_LOOKUP(2);
				DO_LOOKUP(3);
#undef DO_LOOKUP

#define DO_PIX(lx, ly, w0, w1, w2, w3) \
				{ \
					int ca_l = a0 * w0 + a1 * w1 + a2 * w2 + a3 * w3; \
					int cb_l = b0 * w0 + b1 * w1 + b2 * w2 + b3 * w3; \
					int cl = block_colors_y_x16[g_etc1_x_selector_unpack[ly][lookup_x[lx]]]; \
					int dl = cb_l - ca_l; \
					int vl = cl - ca_l; \
					int p = vl * 16; \
					if (ca_l > cb_l) { p = -p; dl = -dl; } \
					uint32_t m = 0; \
					if (p > 3 * dl) m = (uint32_t)(1 << ((ly) * 8 + (lx) * 2)); \
					if (p > 8 * dl) m = (uint32_t)(2 << ((ly) * 8 + (lx) * 2)); \
					if (p > 13 * dl) m = (uint32_t)(3 << ((ly) * 8 + (lx) * 2)); \
					mod |= m; \
				}

				{
					const uint32_t ex = 0, ey = 0;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(0, 0, 4, 4, 4, 4);
					DO_PIX(1, 0, 2, 6, 2, 6);
					DO_PIX(0, 1, 2, 2, 6, 6);
					DO_PIX(1, 1, 1, 3, 3, 9);
				}

				{
					const uint32_t ex = 1, ey = 0;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(2, 0, 8, 0, 8, 0);
					DO_PIX(3, 0, 6, 2, 6, 2);
					DO_PIX(2, 1, 4, 0, 12, 0);
					DO_PIX(3, 1, 3, 1, 9, 3);
				}

				{
					const uint32_t ex = 0, ey = 1;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(0, 2, 8, 8, 0, 0);
					DO_PIX(1, 2, 4, 12, 0, 0);
					DO_PIX(0, 3, 6, 6, 2, 2);
					DO_PIX(1, 3, 3, 9, 1, 3);
				}

				{
					const uint32_t ex = 1, ey = 1;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(2, 2, 16, 0, 0, 0);
					DO_PIX(3, 2, 12, 4, 0, 0);
					DO_PIX(2, 3, 12, 0, 4, 0);
					DO_PIX(3, 3, 9, 3, 3, 1);
				}
#undef DO_PIX

				pDst_block->m_modulation = mod;

				e0[0][0] = e0[1][0]; e0[1][0] = e0[2][0];
				e0[0][1] = e0[1][1]; e0[1][1] = e0[2][1];
				e0[0][2] = e0[1][2]; e0[1][2] = e0[2][2];

				e1[0][0] = e1[1][0]; e1[1][0] = e1[2][0];
				e1[0][1] = e1[1][1]; e1[1][1] = e1[2][1];
				e1[0][2] = e1[1][2]; e1[1][2] = e1[2][2];

			} // x
		} // y
	}